

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O0

void __thiscall
TTD::EventLog::RecordJsRTGetAndClearException
          (EventLog *this,TTDJsRTActionResultAutoRecorder *actionPopper)

{
  EventLogEntry *actionEvent;
  EventLogEntry *evt;
  JsRTResultOnlyAction *gcAction;
  TTDJsRTActionResultAutoRecorder *actionPopper_local;
  EventLog *this_local;
  
  evt = (EventLogEntry *)0x0;
  gcAction = (JsRTResultOnlyAction *)actionPopper;
  actionPopper_local = (TTDJsRTActionResultAutoRecorder *)this;
  actionEvent = RecordGetInitializedEvent<TTD::NSLogEvents::JsRTResultOnlyAction,(TTD::NSLogEvents::EventKind)43>
                          (this,(JsRTResultOnlyAction **)&evt);
  TTDJsRTActionResultAutoRecorder::InitializeWithEventAndEnterWResult
            ((TTDJsRTActionResultAutoRecorder *)gcAction,actionEvent,(TTDVar *)evt);
  return;
}

Assistant:

void EventLog::RecordJsRTGetAndClearException(TTDJsRTActionResultAutoRecorder& actionPopper)
    {
        NSLogEvents::JsRTResultOnlyAction* gcAction = nullptr;
        NSLogEvents::EventLogEntry* evt = this->RecordGetInitializedEvent<NSLogEvents::JsRTResultOnlyAction, NSLogEvents::EventKind::GetAndClearExceptionActionTag>(&gcAction);

        actionPopper.InitializeWithEventAndEnterWResult(evt, &(gcAction->Result));
    }